

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawListSplitter::ClearFreeMemory(ImDrawListSplitter *this)

{
  ImDrawChannel *pIVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  iVar3 = (this->_Channels).Size;
  if (0 < iVar3) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      if (uVar5 == (uint)this->_Current) {
        *(undefined1 (*) [32])((long)&(((this->_Channels).Data)->_CmdBuffer).Size + lVar6) =
             ZEXT1632(ZEXT816(0) << 0x40);
        iVar3 = (this->_Channels).Size;
      }
      lVar4 = (long)iVar3;
      if (lVar4 <= (long)uVar5) {
LAB_00184b31:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                      ,0x66a,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
      }
      pIVar1 = (this->_Channels).Data;
      pvVar2 = *(void **)((long)&(pIVar1->_CmdBuffer).Data + lVar6);
      if (pvVar2 != (void *)0x0) {
        *(undefined8 *)((long)&(pIVar1->_CmdBuffer).Size + lVar6) = 0;
        ImGui::MemFree(pvVar2);
        *(undefined8 *)((long)&(pIVar1->_CmdBuffer).Data + lVar6) = 0;
        iVar3 = (this->_Channels).Size;
        lVar4 = (long)iVar3;
      }
      if (lVar4 <= (long)uVar5) goto LAB_00184b31;
      pIVar1 = (this->_Channels).Data;
      pvVar2 = *(void **)((long)&(pIVar1->_IdxBuffer).Data + lVar6);
      if (pvVar2 != (void *)0x0) {
        *(undefined8 *)((long)&(pIVar1->_IdxBuffer).Size + lVar6) = 0;
        ImGui::MemFree(pvVar2);
        *(undefined8 *)((long)&(pIVar1->_IdxBuffer).Data + lVar6) = 0;
        iVar3 = (this->_Channels).Size;
        lVar4 = (long)iVar3;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x20;
    } while ((long)uVar5 < lVar4);
  }
  this->_Current = 0;
  this->_Count = 1;
  pIVar1 = (this->_Channels).Data;
  if (pIVar1 != (ImDrawChannel *)0x0) {
    (this->_Channels).Size = 0;
    (this->_Channels).Capacity = 0;
    ImGui::MemFree(pIVar1);
    (this->_Channels).Data = (ImDrawChannel *)0x0;
  }
  return;
}

Assistant:

void ImDrawListSplitter::ClearFreeMemory()
{
    for (int i = 0; i < _Channels.Size; i++)
    {
        if (i == _Current)
            memset(&_Channels[i], 0, sizeof(_Channels[i]));  // Current channel is a copy of CmdBuffer/IdxBuffer, don't destruct again
        _Channels[i]._CmdBuffer.clear();
        _Channels[i]._IdxBuffer.clear();
    }
    _Current = 0;
    _Count = 1;
    _Channels.clear();
}